

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O2

bool __thiscall
spvtools::val::anon_unknown_0::hasDecoration
          (anon_unknown_0 *this,uint32_t id,Decoration decoration,ValidationState_t *vstate)

{
  bool bVar1;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar2;
  _Base_ptr p_Var3;
  Instruction *pIVar4;
  undefined4 in_register_00000014;
  bool bVar5;
  uint32_t id_00;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  id_00 = (uint32_t)this;
  psVar2 = ValidationState_t::id_decorations
                     ((ValidationState_t *)CONCAT44(in_register_00000014,decoration),id_00);
  for (p_Var3 = (psVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    if (p_Var3[1]._M_color == id) {
      return true;
    }
  }
  pIVar4 = ValidationState_t::FindDef
                     ((ValidationState_t *)CONCAT44(in_register_00000014,decoration),id_00);
  if ((pIVar4->inst_).opcode == 0x1e) {
    getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,id_00,
                     decoration,vstate);
    do {
      bVar5 = local_40._M_impl.super__Vector_impl_data._M_start !=
              local_40._M_impl.super__Vector_impl_data._M_finish;
      if (local_40._M_impl.super__Vector_impl_data._M_start ==
          local_40._M_impl.super__Vector_impl_data._M_finish) break;
      bVar1 = hasDecoration((anon_unknown_0 *)
                            (ulong)*local_40._M_impl.super__Vector_impl_data._M_start,id,decoration,
                            vstate);
      local_40._M_impl.super__Vector_impl_data._M_start =
           local_40._M_impl.super__Vector_impl_data._M_start + 1;
    } while (!bVar1);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool hasDecoration(uint32_t id, spv::Decoration decoration,
                   ValidationState_t& vstate) {
  for (auto& dec : vstate.id_decorations(id)) {
    if (decoration == dec.dec_type()) return true;
  }
  if (spv::Op::OpTypeStruct != vstate.FindDef(id)->opcode()) {
    return false;
  }
  for (auto member_id : getStructMembers(id, spv::Op::OpTypeStruct, vstate)) {
    if (hasDecoration(member_id, decoration, vstate)) {
      return true;
    }
  }
  return false;
}